

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::image::anon_unknown_0::LoadStoreTest::createInstance(LoadStoreTest *this,Context *context)

{
  LoadStoreTestInstance *pLVar1;
  Texture *pTVar2;
  int *piVar3;
  VkFormat format;
  VkFormat VVar4;
  LoadStoreTestInstance *this_00;
  DeviceInterface *pDVar5;
  VkDevice device;
  Allocator *pAVar6;
  Buffer *this_01;
  Image *pIVar7;
  VkImageCreateFlags flags;
  UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_c8;
  LoadStoreTestInstance *local_b8;
  Texture *local_b0;
  VkDevice local_a8;
  int *local_a0;
  LoadStoreTestInstance *local_98;
  int *local_90;
  VkImageCreateInfo local_88;
  
  if ((this->m_texture).m_type == IMAGE_TYPE_BUFFER) {
    this_00 = (LoadStoreTestInstance *)operator_new(0x128);
    LoadStoreTestInstance::LoadStoreTestInstance
              (this_00,context,&this->m_texture,this->m_format,this->m_imageFormat,
               this->m_declareImageFormatInShader,false);
    (this_00->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__BufferLoadStoreTestInstance_00cfe228;
    pLVar1 = this_00 + 1;
    this_00[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    memset(&this_00[1].super_BaseTestInstance.m_texture,0,0xa0);
    pDVar5 = Context::getDeviceInterface
                       ((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    device = Context::getDevice((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    pAVar6 = Context::getDefaultAllocator
                       ((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    this_01 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_88,this_00->m_imageSizeBytes,8);
    image::Buffer::Buffer
              (this_01,pDVar5,device,pAVar6,(VkBufferCreateInfo *)&local_88,(MemoryRequirement)0x1);
    local_c8.m_data.ptr = (Buffer *)0x0;
    if ((Buffer *)(pLVar1->super_BaseTestInstance).super_TestInstance._vptr_TestInstance != this_01)
    {
      de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
                ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)pLVar1);
      (pLVar1->super_BaseTestInstance).super_TestInstance._vptr_TestInstance = (_func_int **)this_01
      ;
    }
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              (&local_c8);
  }
  else {
    this_00 = (LoadStoreTestInstance *)operator_new(0x120);
    LoadStoreTestInstance::LoadStoreTestInstance
              (this_00,context,&this->m_texture,this->m_format,this->m_imageFormat,
               this->m_declareImageFormatInShader,this->m_singleLayerBind);
    (this_00->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ImageLoadStoreTestInstance_00cfe328;
    local_b8 = this_00 + 1;
    this_00[1].super_BaseTestInstance.super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    local_b0 = &this_00[1].super_BaseTestInstance.m_texture;
    this_00[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[0] = 0;
    this_00[1].super_BaseTestInstance.m_texture.m_layerSize.m_data[1] = 0;
    piVar3 = this_00[1].m_referenceImage.m_size.m_data + 2;
    this_00[1].super_BaseTestInstance.m_texture.m_numLayers = 0;
    this_00[1].super_BaseTestInstance.m_texture.m_numSamples = 0;
    this_00[1].super_BaseTestInstance.m_format = VK_FORMAT_UNDEFINED;
    this_00[1].super_BaseTestInstance.m_declareImageFormatInShader = false;
    this_00[1].super_BaseTestInstance.m_singleLayerBind = false;
    *(undefined2 *)&this_00[1].super_BaseTestInstance.field_0x2e = 0;
    this_00[1].m_imageBuffer.
    super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
         (Buffer *)0x0;
    *(undefined8 *)
     &this_00[1].m_imageBuffer.
      super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.field_0x8
         = 0;
    this_00[1].m_imageSizeBytes = 0;
    *(undefined8 *)&this_00[1].m_imageFormat = 0;
    this_00[1].m_referenceImage.m_format.order = R;
    this_00[1].m_referenceImage.m_format.type = SNORM_INT8;
    this_00[1].m_referenceImage.m_size.m_data[0] = 0;
    this_00[1].m_referenceImage.m_size.m_data[1] = 0;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              *)piVar3,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    local_90 = piVar3;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)(this_00 + 2),(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    piVar3 = this_00[2].super_BaseTestInstance.m_texture.m_layerSize.m_data + 2;
    local_98 = this_00 + 2;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
    ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              *)piVar3,(long)(this->m_texture).m_numLayers,(allocator_type *)&local_88);
    local_a0 = piVar3;
    pDVar5 = Context::getDeviceInterface
                       ((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    local_a8 = Context::getDevice((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    pAVar6 = Context::getDefaultAllocator
                       ((this_00->super_BaseTestInstance).super_TestInstance.m_context);
    format = this_00->m_imageFormat;
    VVar4 = (this_00->super_BaseTestInstance).m_format;
    pIVar7 = (Image *)operator_new(0x30);
    flags = (uint)(VVar4 != format) << 3;
    pTVar2 = &(this_00->super_BaseTestInstance).m_texture;
    makeImageCreateInfo(&local_88,pTVar2,format,10,flags);
    Image::Image(pIVar7,pDVar5,local_a8,pAVar6,&local_88,(MemoryRequirement)0x0);
    pLVar1 = local_b8;
    local_c8.m_data.ptr = (Buffer *)0x0;
    if ((Image *)(local_b8->super_BaseTestInstance).super_TestInstance._vptr_TestInstance != pIVar7)
    {
      de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_b8);
      (pLVar1->super_BaseTestInstance).super_TestInstance._vptr_TestInstance = (_func_int **)pIVar7;
    }
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_c8);
    pIVar7 = (Image *)operator_new(0x30);
    makeImageCreateInfo(&local_88,pTVar2,this_00->m_imageFormat,9,flags);
    Image::Image(pIVar7,pDVar5,local_a8,pAVar6,&local_88,(MemoryRequirement)0x0);
    pTVar2 = local_b0;
    local_c8.m_data.ptr = (Buffer *)0x0;
    if (*(Image **)(local_b0->m_layerSize).m_data != pIVar7) {
      de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
                ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)local_b0);
      *(Image **)(pTVar2->m_layerSize).m_data = pIVar7;
    }
    de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
              ((UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *)&local_c8);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* LoadStoreTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferLoadStoreTestInstance(context, m_texture, m_format, m_imageFormat, m_declareImageFormatInShader);
	else
		return new ImageLoadStoreTestInstance(context, m_texture, m_format, m_imageFormat, m_declareImageFormatInShader, m_singleLayerBind);
}